

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O0

void api_suite::api_data_const(void)

{
  size_type *this;
  pointer *pptVar1;
  initializer_list<int> input;
  initializer_list<int> input_00;
  pointer ptVar2;
  const_pointer ptVar3;
  reference piVar4;
  const_iterator local_228;
  undefined1 local_218 [8];
  const_segment clast_2;
  undefined1 local_1f8 [8];
  const_segment last_2;
  undefined1 local_1d8 [8];
  const_segment cfirst_2;
  undefined1 local_1b8 [8];
  const_segment first_2;
  circular_view<int,_18446744073709551615UL> span_2;
  const_iterator local_158;
  undefined1 local_148 [8];
  const_segment clast_1;
  undefined1 local_128 [8];
  const_segment last_1;
  undefined1 local_108 [8];
  const_segment cfirst_1;
  undefined1 local_e8 [8];
  const_segment first_1;
  circular_view<int,_18446744073709551615UL> span_1;
  int local_ac;
  iterator local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  const_segment clast;
  const_segment last;
  const_segment cfirst;
  const_segment first;
  circular_view<int,_18446744073709551615UL> span;
  circular_view<int,_18446744073709551615UL> original;
  int array [4];
  
  original.member.next = 0;
  this = &span.member.next;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)this,
             (value_type (*) [4])&original.member.next);
  span.member.cap = original.member.cap;
  span.member.size = original.member.size;
  first.member.tail = (pointer)span.member.next;
  span.member.data = original.member.data;
  pptVar1 = &first.member.tail;
  join_0x00000010_0x00000000_ =
       (member_storage<const_int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)&cfirst.member.tail);
  boost::detail::test_impl
            ("first.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x46,"void api_suite::api_data_const()",ptVar2 == (pointer)0x0);
  join_0x00000010_0x00000000_ =
       (member_storage<const_int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)&last.member.tail);
  boost::detail::test_impl
            ("cfirst.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x48,"void api_suite::api_data_const()",ptVar3 == (const_pointer)0x0);
  join_0x00000010_0x00000000_ =
       (member_storage<const_int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)&clast.member.tail);
  boost::detail::test_impl
            ("last.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4a,"void api_suite::api_data_const()",ptVar2 == (pointer)0x0);
  _local_98 = (member_storage<const_int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::last_segment
                        ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_98);
  boost::detail::test_impl
            ("clast.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4c,"void api_suite::api_data_const()",ptVar3 == (const_pointer)0x0);
  local_ac = 0xb;
  local_a8 = &local_ac;
  local_a0 = 1;
  input_00._M_len = 1;
  input_00._M_array = local_a8;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)this,input_00);
  first_1.member.tail = (pointer)span.member.next;
  pptVar1 = &first_1.member.tail;
  _local_e8 = (member_storage<const_int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::first_segment
                        ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_e8);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&cfirst_1.member.tail);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x52,"void api_suite::api_data_const()",ptVar2 == piVar4);
  _local_108 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_108);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&last_1.member.tail);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x54,"void api_suite::api_data_const()",ptVar3 == piVar4);
  _local_128 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_128);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::end
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&clast_1.member.tail);
  boost::detail::test_impl
            ("last.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x56,"void api_suite::api_data_const()",ptVar2 != piVar4);
  _local_148 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_148);
  local_158 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_158);
  boost::detail::test_impl
            ("clast.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x58,"void api_suite::api_data_const()",ptVar3 != piVar4);
  span_2.member.next = 0x160000000b;
  input._M_len = 5;
  input._M_array = (iterator)&span_2.member.next;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)this,input);
  span_2.member.cap = original.member.cap;
  span_2.member.size = original.member.size;
  first_2.member.tail = (pointer)span.member.next;
  span_2.member.data = original.member.data;
  pptVar1 = &first_2.member.tail;
  _local_1b8 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_1b8);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&cfirst_2.member.tail);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x60,"void api_suite::api_data_const()",ptVar2 == piVar4);
  _local_1d8 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_1d8);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&last_2.member.tail);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x62,"void api_suite::api_data_const()",ptVar3 == piVar4);
  _local_1f8 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar2 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_1f8);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     ((basic_iterator<const_int> *)&clast_2.member.tail);
  boost::detail::test_impl
            ("last.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,100,"void api_suite::api_data_const()",ptVar2 != piVar4);
  _local_218 = (member_storage<const_int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  ptVar3 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)local_218);
  local_228 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)pptVar1);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_228);
  boost::detail::test_impl
            ("clast.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x66,"void api_suite::api_data_const()",(bool)(-(ptVar3 != piVar4) & 1));
  return;
}

Assistant:

void api_data_const()
{
    int array[4] = {};
    circular_view<int> original(array);
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == nullptr);
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == nullptr);
        auto last = span.last_segment();
        BOOST_TEST(last.data() == nullptr);
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() == nullptr);
    }
    original = { 11 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.end());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.end());
    }
    // 55 22 33 44
    // -> <-------
    original = { 11, 22, 33, 44, 55 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.begin());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.begin());
    }
}